

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::push_real_array(Simulator *this,PCode *code)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Symbol *pSVar4;
  string *str;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  ScopeTree *this_00;
  Symbol offset;
  Symbol symbol;
  undefined1 local_180 [40];
  vector<Symbol,_std::allocator<Symbol>_> local_158;
  pointer local_140;
  pointer local_138;
  pointer local_118;
  StackSymbol local_f8;
  Symbol local_b0;
  
  this_00 = &this->tree_;
  pSVar4 = ScopeTree::resolve(this_00,&code->first_);
  Symbol::Symbol(&local_b0,pSVar4);
  str = &code->second_;
  bVar3 = Recognition::is_integer(str);
  if (!bVar3) {
LAB_0011c00e:
    pSVar4 = ScopeTree::resolve(this_00,str);
    Symbol::Symbol((Symbol *)local_180,pSVar4);
    if ((ulong)((long)local_b0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)(long)(int)local_140
       ) goto LAB_0011c1cf;
    local_f8.type_ = kReal;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8.value_.real_value =
         local_b0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[(int)local_140];
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,&local_f8);
    if (local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.value_.real_array.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.value_.int_array.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_118 != (pointer)0x0) {
      operator_delete(local_118);
    }
    if (local_138 != (pointer)0x0) {
      operator_delete(local_138);
    }
    std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_158);
    puVar7 = (undefined1 *)CONCAT44(local_180._4_4_,local_180._0_4_);
    if ((undefined1 *)CONCAT44(local_180._4_4_,local_180._0_4_) == local_180 + 0x10)
    goto LAB_0011c156;
LAB_0011c151:
    operator_delete(puVar7);
LAB_0011c156:
    this->eip_ = this->eip_ + 1;
    if (local_b0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.value_.real_array.super__Vector_base<double,_std::allocator<double>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.value_.int_array.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Symbol,_std::allocator<Symbol>_>::~vector(&local_b0.value_.args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.name_._M_dataplus._M_p != &local_b0.name_.field_2) {
      operator_delete(local_b0.name_._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (ScopeTree *)(str->_M_dataplus)._M_p;
  str = (string *)__errno_location();
  iVar1 = *(int *)&(str->_M_dataplus)._M_p;
  *(int *)&(str->_M_dataplus)._M_p = 0;
  uVar5 = strtoul((char *)this_00,(char **)&local_f8,10);
  if ((ScopeTree *)CONCAT44(local_f8._4_4_,local_f8.type_) == this_00) {
    uVar5 = std::__throw_invalid_argument("stoul");
  }
  else {
    iVar2 = *(int *)&(str->_M_dataplus)._M_p;
    if (iVar2 == 0) {
      *(int *)&(str->_M_dataplus)._M_p = iVar1;
    }
    else if (iVar2 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_0011c00e;
    }
    if (uVar5 < (ulong)((long)local_b0.value_.real_array.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_b0.value_.real_array.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3)) {
      local_180._0_4_ = kReal;
      local_180._16_8_ = (undefined1 *)0x0;
      local_180._24_8_ = 0;
      local_180._32_8_ = (pointer)0x0;
      local_158.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_158.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_140 = (pointer)0x0;
      local_158.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_b0.value_.real_array.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5];
      std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
                (&this->stack_,(StackSymbol *)local_180);
      if (local_158.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(local_158.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                        super__Vector_impl_data._M_finish);
      }
      puVar7 = (undefined1 *)local_180._16_8_;
      if ((undefined1 *)local_180._16_8_ == (undefined1 *)0x0) goto LAB_0011c156;
      goto LAB_0011c151;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
LAB_0011c1cf:
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  StackSymbol::~StackSymbol(&local_f8);
  Symbol::~Symbol((Symbol *)local_180);
  Symbol::~Symbol(&local_b0);
  _Unwind_Resume(uVar6);
}

Assistant:

void Simulator::push_real_array(const PCode &code) {
    Symbol symbol = tree_.resolve(code.first());
    if (Recognition::is_integer(code.second())) {
        stack_.push_back(StackSymbol(symbol.real_array().at(std::stoul(code.second()))));
    } else {
        Symbol offset = tree_.resolve(code.second());
        stack_.push_back(StackSymbol(symbol.real_array().at((unsigned long)offset.int_value())));
    }
    inc_eip();
}